

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O0

void av1_quant(MACROBLOCK *x,int plane,int block,TxfmParam *txfm_param,QUANT_PARAM *qparam)

{
  tran_low_t *ptVar1;
  tran_low_t *ptVar2;
  tran_low_t *ptVar3;
  uint8_t uVar4;
  int iVar5;
  MACROBLOCK_PLANE *pMVar6;
  SCAN_ORDER *pSVar7;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  QUANT_PARAM *in_R8;
  int n_coeffs;
  uint16_t *eob;
  tran_low_t *dqcoeff;
  tran_low_t *qcoeff;
  tran_low_t *coeff;
  int block_offset;
  SCAN_ORDER *scan_order;
  macroblock_plane *p;
  uint16_t *in_stack_ffffffffffffff88;
  tran_low_t *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  uint16_t *qcoeff_00;
  
  pMVar6 = (MACROBLOCK_PLANE *)(in_RDI + (long)in_ESI * 0x88);
  pSVar7 = get_scan('\0','\0');
  iVar5 = in_EDX << 4;
  ptVar1 = pMVar6->coeff;
  ptVar2 = pMVar6->qcoeff;
  ptVar3 = pMVar6->dqcoeff;
  qcoeff_00 = pMVar6->eobs + in_EDX;
  if (in_R8->xform_quant_idx != 3) {
    in_stack_ffffffffffffffa4 = av1_get_max_eob(*(TX_SIZE *)(in_RCX + 1));
    if (*(int *)(in_RDI + 0x15230) == 0) {
      (*quant_func_list[in_R8->xform_quant_idx][*(int *)(in_RCX + 0xc)])
                (ptVar1 + iVar5,(long)in_stack_ffffffffffffffa4,pMVar6,ptVar2 + iVar5,ptVar3 + iVar5
                 ,qcoeff_00,pSVar7,in_R8);
    }
    else {
      av1_quantize_skip(CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        (tran_low_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                        in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
  }
  if (in_R8->use_optimize_b == 0) {
    uVar4 = av1_get_txb_entropy_context
                      ((tran_low_t *)qcoeff_00,
                       (SCAN_ORDER *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff9c);
    pMVar6->txb_entropy_ctx[in_EDX] = uVar4;
  }
  else {
    pMVar6->txb_entropy_ctx[in_EDX] = '\0';
  }
  return;
}

Assistant:

void av1_quant(MACROBLOCK *x, int plane, int block, TxfmParam *txfm_param,
               const QUANT_PARAM *qparam) {
  const struct macroblock_plane *const p = &x->plane[plane];
  const SCAN_ORDER *const scan_order =
      get_scan(txfm_param->tx_size, txfm_param->tx_type);
  const int block_offset = BLOCK_OFFSET(block);
  tran_low_t *const coeff = p->coeff + block_offset;
  tran_low_t *const qcoeff = p->qcoeff + block_offset;
  tran_low_t *const dqcoeff = p->dqcoeff + block_offset;
  uint16_t *const eob = &p->eobs[block];

  if (qparam->xform_quant_idx != AV1_XFORM_QUANT_SKIP_QUANT) {
    const int n_coeffs = av1_get_max_eob(txfm_param->tx_size);
    if (LIKELY(!x->seg_skip_block)) {
#if CONFIG_AV1_HIGHBITDEPTH
      quant_func_list[qparam->xform_quant_idx][txfm_param->is_hbd](
          coeff, n_coeffs, p, qcoeff, dqcoeff, eob, scan_order, qparam);
#else
      quant_func_list[qparam->xform_quant_idx](
          coeff, n_coeffs, p, qcoeff, dqcoeff, eob, scan_order, qparam);
#endif
    } else {
      av1_quantize_skip(n_coeffs, qcoeff, dqcoeff, eob);
    }
  }
  // use_optimize_b is true means av1_optimze_b will be called,
  // thus cannot update entropy ctx now (performed in optimize_b)
  if (qparam->use_optimize_b) {
    p->txb_entropy_ctx[block] = 0;
  } else {
    p->txb_entropy_ctx[block] =
        av1_get_txb_entropy_context(qcoeff, scan_order, *eob);
  }
}